

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quadrule.cpp
# Opt level: O0

void hermite_ek_compute(int n,double *x,double *w)

{
  undefined1 auVar1 [16];
  ulong uVar2;
  double *e;
  double dVar3;
  double dVar4;
  double zemu;
  int i;
  double *bj;
  double arg;
  double *w_local;
  double *x_local;
  int n_local;
  
  dVar3 = tgamma(0.5);
  auVar1._8_8_ = 0;
  auVar1._0_8_ = (long)n;
  uVar2 = SUB168(auVar1 * ZEXT816(8),0);
  if (SUB168(auVar1 * ZEXT816(8),8) != 0) {
    uVar2 = 0xffffffffffffffff;
  }
  e = (double *)operator_new__(uVar2);
  for (zemu._4_4_ = 0; zemu._4_4_ < n; zemu._4_4_ = zemu._4_4_ + 1) {
    dVar4 = sqrt((double)(zemu._4_4_ + 1) / 2.0);
    e[zemu._4_4_] = dVar4;
  }
  for (zemu._4_4_ = 0; zemu._4_4_ < n; zemu._4_4_ = zemu._4_4_ + 1) {
    x[zemu._4_4_] = 0.0;
  }
  dVar3 = sqrt(dVar3);
  *w = dVar3;
  for (zemu._4_4_ = 1; zemu._4_4_ < n; zemu._4_4_ = zemu._4_4_ + 1) {
    w[zemu._4_4_] = 0.0;
  }
  imtqlx(n,x,e,w);
  if (n % 2 == 1) {
    x[(n + -1) / 2] = 0.0;
  }
  for (zemu._4_4_ = 0; zemu._4_4_ < n; zemu._4_4_ = zemu._4_4_ + 1) {
    w[zemu._4_4_] = w[zemu._4_4_] * w[zemu._4_4_];
  }
  if (e != (double *)0x0) {
    operator_delete__(e);
  }
  return;
}

Assistant:

void hermite_ek_compute ( int n, double x[], double w[] )

//****************************************************************************80
//
//  Purpose:
//
//    HERMITE_EK_COMPUTE computes a Gauss-Hermite quadrature rule.
//
//  Discussion:
//
//    The code uses an algorithm by Elhay and Kautsky.
//
//    The abscissas are the zeros of the N-th order Hermite polynomial.
//
//    The integral:
//
//      integral ( -oo < x < +oo ) exp ( - x * x ) * f(x) dx
//
//    The quadrature rule:
//
//      sum ( 1 <= i <= n ) w(i) * f ( x(i) )
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    09 May 2012
//
//  Author:
//
//    Original FORTRAN77 version by Sylvan Elhay, Jaroslav Kautsky.
//    C++ version by John Burkardt.
//
//  Reference:
//
//    Sylvan Elhay, Jaroslav Kautsky,
//    Algorithm 655: IQPACK, FORTRAN Subroutines for the Weights of
//    Interpolatory Quadrature,
//    ACM Transactions on Mathematical Software,
//    Volume 13, Number 4, December 1987, pages 399-415.
//
//  Parameters:
//
//    Input, int N, the number of abscissas.
//
//    Output, double X[N], the abscissas.
//
//    Output, double W[N], the weights.
//
{
  double arg;
  double *bj;
  int i;
  double zemu;
//
//  Define the zero-th moment.
//
  arg = 0.5;
  zemu = tgamma ( arg );
//
//  Define the Jacobi matrix.
//
  bj = new double[n];

  for ( i = 0; i < n; i++ )
  {
    bj[i] = sqrt ( double( i + 1 ) / 2.0 );
  }

  for ( i = 0; i < n; i++ )
  {
    x[i] = 0.0;
  }

  w[0] = sqrt ( zemu );
  for ( i = 1; i < n; i++ )
  {
    w[i] = 0.0;
  }
//
//  Diagonalize the Jacobi matrix.
//
  imtqlx ( n, x, bj, w );
//
//  If N is odd, force the center X to be 0.
//
  if ( ( n % 2 ) == 1 )
  {
    x[(n-1)/2] = 0.0;
  }

  for ( i = 0; i < n; i++ )
  {
    w[i] = w[i] * w[i];
  }

  delete [] bj;

  return;
}